

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O1

void __thiscall
LruHash<IPAsKeyLRU>::LruMoveToMostRecent(LruHash<IPAsKeyLRU> *this,IPAsKeyLRU *key,bool stored)

{
  IPAsKeyLRU *pIVar1;
  LruHash<IPAsKeyLRU> *pLVar2;
  IPAsKeyLRU **ppIVar3;
  
  if (key != (IPAsKeyLRU *)0x0) {
    if (!stored) {
      pIVar1 = key->MoreRecentKey;
      pLVar2 = (LruHash<IPAsKeyLRU> *)&pIVar1->LessRecentKey;
      if (pIVar1 == (IPAsKeyLRU *)0x0) {
        pLVar2 = this;
      }
      pLVar2->MostRecentlyUsed = key->LessRecentKey;
      ppIVar3 = &key->LessRecentKey->MoreRecentKey;
      if (key->LessRecentKey == (IPAsKeyLRU *)0x0) {
        ppIVar3 = &this->LeastRecentlyUsed;
      }
      *ppIVar3 = pIVar1;
      key->MoreRecentKey = (IPAsKeyLRU *)0x0;
      key->LessRecentKey = (IPAsKeyLRU *)0x0;
    }
    pIVar1 = this->MostRecentlyUsed;
    key->LessRecentKey = pIVar1;
    if (pIVar1 != (IPAsKeyLRU *)0x0) {
      pIVar1->MoreRecentKey = key;
    }
    this->MostRecentlyUsed = key;
    if (this->LeastRecentlyUsed == (IPAsKeyLRU *)0x0) {
      this->LeastRecentlyUsed = key;
      return;
    }
  }
  return;
}

Assistant:

void LruMoveToMostRecent(KeyObj * key, bool stored)
    {
        if (key != NULL)
        {
            if (!stored)
            {
                LruUnlink(key);
            }
            key->LessRecentKey = MostRecentlyUsed;
            if (MostRecentlyUsed != NULL)
            {
                MostRecentlyUsed->MoreRecentKey = key;
            }
            MostRecentlyUsed = key;

            if (LeastRecentlyUsed == NULL)
            {
                LeastRecentlyUsed = key;
            }
        }
    }